

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callFunctionTestSuite.cpp
# Opt level: O3

bool callMultipleGetSum(void)

{
  int iVar1;
  _Rb_tree_color _Var2;
  code *pcVar3;
  iterator iVar4;
  bool bVar5;
  long *plVar6;
  char *__end;
  int iVar7;
  Test t;
  key_type local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_60;
  
  Test::Test((Test *)&local_60);
  iVar7 = 0;
  do {
    plVar6 = (long *)(&local_60._M_impl.field_0x0 + DAT_001070e8);
    pcVar3 = accessor::
             Proxy<accessor::FunctionWrapper<Test,int,int,int>,accessor::FunctionWrapper<Test,int,int,int>>
             ::value;
    if (((ulong)accessor::
                Proxy<accessor::FunctionWrapper<Test,int,int,int>,accessor::FunctionWrapper<Test,int,int,int>>
                ::value & 1) != 0) {
      pcVar3 = *(code **)(accessor::
                          Proxy<accessor::FunctionWrapper<Test,int,int,int>,accessor::FunctionWrapper<Test,int,int,int>>
                          ::value + *plVar6 + -1);
    }
    iVar1 = (*pcVar3)(plVar6,iVar7,10);
    if (iVar7 + 10 == iVar1) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"getSum","");
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&local_60,&local_80);
      if ((_Rb_tree_header *)iVar4._M_node == &local_60._M_impl.super__Rb_tree_header) {
        _Var2 = ~_S_red;
      }
      else {
        _Var2 = iVar4._M_node[2]._M_color;
      }
      bVar5 = iVar7 < (int)_Var2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar5 = false;
    }
    iVar7 = iVar7 + 1;
  } while (iVar7 != 10);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_60);
  return bVar5;
}

Assistant:

bool callMultipleGetSum()
{
  Test t;
  int callsNumber = 10;
  bool testResult = false;

  for (int i = 0; i < callsNumber; ++i)
  {
    int expectedSum = i + callsNumber;
    testResult = (::accessor::callFunction<TestGetSum>(t, i, callsNumber) == expectedSum) &&
                 (t.getMethodVisitedCounter("getSum") > i);
  }

  return testResult;
}